

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O3

Tensor * __thiscall
cnn::SimpleExecutionEngine::incremental_forward(SimpleExecutionEngine *this,VariableIndex *i)

{
  ComputationGraph *pCVar1;
  Node *this_00;
  pointer pVVar2;
  pointer pTVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint *puVar12;
  int iVar13;
  pointer pVVar14;
  float *pfVar15;
  undefined4 extraout_var;
  void *pvVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ushort uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> local_48;
  
  pCVar1 = (this->super_ExecutionEngine).cg;
  uVar17 = i->t;
  uVar19 = (ulong)uVar17;
  if ((ulong)((long)(pCVar1->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar1->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar19) {
    __assert_fail("i < cg.nodes.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/exec.cc"
                  ,0x27,
                  "virtual const Tensor &cnn::SimpleExecutionEngine::incremental_forward(VariableIndex)"
                 );
  }
  uVar18 = (this->num_nodes_evaluated).t;
  if (uVar18 == 0) {
    fxs->used = 0;
  }
  if (uVar17 < uVar18) goto LAB_0016a66d;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::resize(&this->nfxs,(ulong)(uVar17 + 1));
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x80);
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((long)local_48.
                       super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x80);
  auVar23 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  *(undefined1 (*) [64])
   local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
   super__Vector_impl_data._M_start = auVar23;
  auVar23 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  *(undefined1 (*) [64])
   ((long)local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>.
          _M_impl.super__Vector_impl_data._M_start + 0x40) = auVar23;
  uVar17 = (this->num_nodes_evaluated).t;
  local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (i->t < uVar17) {
LAB_0016a65d:
    operator_delete(local_48.
                    super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    uVar18 = i->t;
  }
  else {
    do {
      this_00 = (((this->super_ExecutionEngine).cg)->nodes).
                super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar17];
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::resize
                (&local_48,
                 (ulong)((long)(this_00->args).
                               super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this_00->args).
                              super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff);
      pVVar14 = (this_00->args).
                super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar2 = (this_00->args).
               super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pVVar14 != pVVar2) {
        uVar17 = 0;
        do {
          puVar12 = &pVVar14->t;
          uVar19 = (ulong)uVar17;
          uVar17 = uVar17 + 1;
          pVVar14 = pVVar14 + 1;
          *(pointer *)
           ((undefined1 *)
            local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>.
            _M_impl.super__Vector_impl_data._M_start + uVar19 * 8) =
               (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
               super__Vector_impl_data._M_start + *puVar12;
        } while (pVVar14 != pVVar2);
      }
      uVar17 = (this->num_nodes_evaluated).t;
      pTVar3 = (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
               super__Vector_impl_data._M_start;
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      pTVar3[uVar17].d.bd = (this_00->dim).bd;
      uVar7 = *(undefined8 *)((this_00->dim).d + 2);
      uVar10 = *(undefined8 *)((this_00->dim).d + 4);
      uVar11 = *(undefined8 *)((this_00->dim).d + 6);
      pTVar3 = pTVar3 + uVar17;
      *(undefined8 *)(pTVar3->d).d = *(undefined8 *)(this_00->dim).d;
      *(undefined8 *)((pTVar3->d).d + 2) = uVar7;
      *(undefined8 *)((pTVar3->d).d + 4) = uVar10;
      *(undefined8 *)((pTVar3->d).d + 6) = uVar11;
      uVar19 = (ulong)(this_00->dim).nd;
      if (uVar19 == 0) {
        iVar13 = 1;
      }
      else {
        auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar26 = vpbroadcastq_avx512f();
        uVar20 = 0;
        do {
          auVar27 = vpbroadcastq_avx512f();
          auVar28 = vmovdqa64_avx512f(auVar25);
          auVar25 = vporq_avx512f(auVar27,auVar23);
          auVar27 = vporq_avx512f(auVar27,auVar24);
          uVar7 = vpcmpuq_avx512f(auVar27,auVar26,2);
          bVar8 = (byte)uVar7;
          uVar7 = vpcmpuq_avx512f(auVar25,auVar26,2);
          bVar9 = (byte)uVar7;
          uVar21 = CONCAT11(bVar9,bVar8);
          auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->dim).d + uVar20));
          auVar27._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar25._4_4_;
          auVar27._0_4_ = (uint)(bVar8 & 1) * auVar25._0_4_;
          auVar27._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar25._8_4_;
          auVar27._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar25._12_4_;
          auVar27._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar25._16_4_;
          auVar27._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar25._20_4_;
          auVar27._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar25._24_4_;
          auVar27._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar25._28_4_;
          auVar27._32_4_ = (uint)(bVar9 & 1) * auVar25._32_4_;
          auVar27._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar25._36_4_;
          auVar27._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar25._40_4_;
          auVar27._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar25._44_4_;
          auVar27._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar25._48_4_;
          auVar27._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar25._52_4_;
          auVar27._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar25._56_4_;
          auVar27._60_4_ = (uint)(bVar9 >> 7) * auVar25._60_4_;
          uVar20 = uVar20 + 0x10;
          auVar25 = vpmulld_avx512f(auVar27,auVar28);
        } while ((uVar19 + 0xf & 0xfffffffffffffff0) != uVar20);
        auVar23 = vmovdqa32_avx512f(auVar25);
        auVar24._0_4_ = (uint)(bVar8 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar28._0_4_
        ;
        bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar24._4_4_ = (uint)bVar4 * auVar23._4_4_ | (uint)!bVar4 * auVar28._4_4_;
        bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar24._8_4_ = (uint)bVar4 * auVar23._8_4_ | (uint)!bVar4 * auVar28._8_4_;
        bVar4 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar24._12_4_ = (uint)bVar4 * auVar23._12_4_ | (uint)!bVar4 * auVar28._12_4_;
        bVar4 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar24._16_4_ = (uint)bVar4 * auVar23._16_4_ | (uint)!bVar4 * auVar28._16_4_;
        bVar4 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar24._20_4_ = (uint)bVar4 * auVar23._20_4_ | (uint)!bVar4 * auVar28._20_4_;
        bVar4 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar24._24_4_ = (uint)bVar4 * auVar23._24_4_ | (uint)!bVar4 * auVar28._24_4_;
        bVar4 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar24._28_4_ = (uint)bVar4 * auVar23._28_4_ | (uint)!bVar4 * auVar28._28_4_;
        auVar24._32_4_ =
             (uint)(bVar9 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar28._32_4_;
        bVar4 = (bool)(bVar9 >> 1 & 1);
        auVar24._36_4_ = (uint)bVar4 * auVar23._36_4_ | (uint)!bVar4 * auVar28._36_4_;
        bVar4 = (bool)(bVar9 >> 2 & 1);
        auVar24._40_4_ = (uint)bVar4 * auVar23._40_4_ | (uint)!bVar4 * auVar28._40_4_;
        bVar4 = (bool)(bVar9 >> 3 & 1);
        auVar24._44_4_ = (uint)bVar4 * auVar23._44_4_ | (uint)!bVar4 * auVar28._44_4_;
        bVar4 = (bool)(bVar9 >> 4 & 1);
        auVar24._48_4_ = (uint)bVar4 * auVar23._48_4_ | (uint)!bVar4 * auVar28._48_4_;
        bVar4 = (bool)(bVar9 >> 5 & 1);
        auVar24._52_4_ = (uint)bVar4 * auVar23._52_4_ | (uint)!bVar4 * auVar28._52_4_;
        bVar4 = (bool)(bVar9 >> 6 & 1);
        auVar24._56_4_ = (uint)bVar4 * auVar23._56_4_ | (uint)!bVar4 * auVar28._56_4_;
        auVar24._60_4_ =
             (uint)(bVar9 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar28._60_4_;
        auVar22 = vextracti64x4_avx512f(auVar24,1);
        auVar23 = vpmulld_avx512f(auVar24,ZEXT3264(auVar22));
        auVar5 = vpmulld_avx(auVar23._0_16_,auVar23._16_16_);
        auVar6 = vpshufd_avx(auVar5,0xee);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        auVar6 = vpshufd_avx(auVar5,0x55);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        iVar13 = auVar5._0_4_;
      }
      pfVar15 = (float *)AlignedMemoryPool<6U>::allocate
                                   (fxs,(ulong)(iVar13 * (this_00->dim).bd) << 2);
      (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_start[(this->num_nodes_evaluated).t].v = pfVar15;
      if (pfVar15 == (float *)0x0) {
        std::operator<<((ostream *)&std::cerr,"out of memory\n");
LAB_0016a6b0:
        abort();
      }
      iVar13 = (*this_00->_vptr_Node[4])(this_00);
      if (CONCAT44(extraout_var,iVar13) == 0) {
        pvVar16 = (void *)0x0;
      }
      else {
        pvVar16 = AlignedMemoryPool<6U>::allocate(fxs,CONCAT44(extraout_var,iVar13));
        if (pvVar16 == (void *)0x0) {
          std::operator<<((ostream *)&std::cerr,"aux out of memory\n");
          goto LAB_0016a6b0;
        }
      }
      this_00->aux_mem = pvVar16;
      Node::forward(this_00,&local_48,
                    (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start + (this->num_nodes_evaluated).t);
      uVar17 = (this->num_nodes_evaluated).t + 1;
      (this->num_nodes_evaluated).t = uVar17;
      uVar18 = i->t;
    } while (uVar17 <= uVar18);
    if ((undefined1 (*) [64])
        local_48.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (undefined1 (*) [64])0x0) goto LAB_0016a65d;
  }
  uVar19 = (ulong)uVar18;
LAB_0016a66d:
  return (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
         super__Vector_impl_data._M_start + uVar19;
}

Assistant:

const Tensor& SimpleExecutionEngine::incremental_forward(VariableIndex i) {
  assert(i < cg.nodes.size());

  // free any old memory if this is a new CG
  if (num_nodes_evaluated == 0) fxs->free();

  if (i >= num_nodes_evaluated) {
    nfxs.resize(i + 1);

    //vector<string> dummy(5, "x");
    vector<const Tensor*> xs(16);
    for (; num_nodes_evaluated <= i; ++num_nodes_evaluated) {
      const Node* node = cg.nodes[num_nodes_evaluated];
      xs.resize(node->arity());
      unsigned ai = 0;
      for (VariableIndex arg : node->args) {
        xs[ai] = &nfxs[arg];
        ++ai;
      }
      nfxs[num_nodes_evaluated].d = node->dim;
      nfxs[num_nodes_evaluated].v = static_cast<float*>(fxs->allocate(node->dim.size() * sizeof(float)));
      if (nfxs[num_nodes_evaluated].v == nullptr) {
        cerr << "out of memory\n";
        abort();
      }
      void* aux_mem = nullptr;
      size_t aux_size = node->aux_storage_size();
      if (aux_size) {
        aux_mem = fxs->allocate(aux_size);
        if (!aux_mem) {
          cerr << "aux out of memory\n";
          abort();
        }
      }
      node->aux_mem = aux_mem;
      node->forward(xs, nfxs[num_nodes_evaluated]);
    }
  }
  return nfxs[i];
}